

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_erase(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
           *this,size_t element_idx)

{
  bool bVar1;
  lru_iterator *__x;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffff78;
  _List_const_iterator<unsigned_long> local_40;
  _List_const_iterator<unsigned_long> local_38;
  _List_node_base *local_30;
  _Self local_28;
  reference local_20;
  element *e;
  size_t element_idx_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  e = (element *)element_idx;
  element_idx_local = (size_t)this;
  local_20 = std::
             vector<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
             ::operator[]((vector<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
                           *)(this + 0x30),element_idx);
  __x = &local_20->m_lru_position;
  local_30 = *(_List_node_base **)(this + 200);
  local_28._M_node = (_List_node_base *)std::prev<std::_List_iterator<unsigned_long>>(local_30,1);
  bVar1 = std::operator!=(__x,&local_28);
  if (bVar1) {
    std::_List_const_iterator<unsigned_long>::_List_const_iterator
              (&local_38,(iterator *)(this + 200));
    std::_List_const_iterator<unsigned_long>::_List_const_iterator
              (&local_40,&local_20->m_lru_position);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x80),
               (int)local_38._M_node,(__off64_t *)(this + 0x80),(int)local_40._M_node,in_R8,in_R9,
               in_stack_ffffffffffffff78);
  }
  std::_List_iterator<unsigned_long>::operator--((_List_iterator<unsigned_long> *)(this + 200));
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
  ::erase_abi_cxx11_((multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)(this + 0x98),(local_20->m_ttl_position)._M_node);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::erase((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)(this + 0x48),
          (iterator)
          (local_20->m_keyed_position).
          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + -1;
  return;
}

Assistant:

auto do_erase(size_t element_idx) -> void
    {
        element& e = m_elements[element_idx];

        // splice into the end position of the LRU if it isn't the last item...
        if (e.m_lru_position != std::prev(m_lru_end))
        {
            m_lru_list.splice(m_lru_end, m_lru_list, e.m_lru_position);
        }
        --m_lru_end;

        m_ttl_list.erase(e.m_ttl_position);

        m_keyed_elements.erase(e.m_keyed_position);

        // destruct e.m_value when re-assigned on an insert.

        --m_used_size;
    }